

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O2

void FCanvasTextureInfo::Add(AActor *viewpoint,FTextureID picnum,int fov)

{
  AActor *pAVar1;
  FCanvasTextureInfo *pFVar2;
  FCanvasTextureInfo **ppFVar3;
  FCanvasTexture *pFVar4;
  
  if (0 < picnum.texnum) {
    if ((uint)picnum.texnum < TexMan.Textures.Count) {
      pFVar4 = (FCanvasTexture *)TexMan.Textures.Array[(uint)picnum.texnum].Texture;
    }
    else {
      pFVar4 = (FCanvasTexture *)0x0;
    }
    if (((pFVar4->super_FTexture).field_0x31 & 0x20) == 0) {
      Printf("%s is not a valid target for a camera\n",(pFVar4->super_FTexture).Name.Chars);
      return;
    }
    ppFVar3 = &List;
    do {
      ppFVar3 = &((FCanvasTextureInfo *)ppFVar3)->Next->Next;
      if ((FCanvasTextureInfo *)ppFVar3 == (FCanvasTextureInfo *)0x0) {
        pFVar2 = (FCanvasTextureInfo *)operator_new(0x20);
        (pFVar2->Viewpoint).field_0.p = viewpoint;
        pFVar2->Texture = pFVar4;
        (pFVar2->PicNum).texnum = picnum.texnum;
        pFVar2->FOV = fov;
        pFVar2->Next = List;
        pFVar4->bFirstUpdate = true;
        List = pFVar2;
        return;
      }
    } while (((FCanvasTextureInfo *)ppFVar3)->Texture != pFVar4);
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)&((FCanvasTextureInfo *)ppFVar3)->Viewpoint);
    if ((pAVar1 != viewpoint) || (((FCanvasTextureInfo *)ppFVar3)->FOV != fov)) {
      pFVar4->bFirstUpdate = true;
    }
    (((FCanvasTextureInfo *)ppFVar3)->Viewpoint).field_0.p = viewpoint;
    ((FCanvasTextureInfo *)ppFVar3)->FOV = fov;
  }
  return;
}

Assistant:

void R_SetFOV (DAngle fov)
{

	if (fov < 5.) fov = 5.;
	else if (fov > 170.) fov = 170.;
	if (fov != FieldOfView)
	{
		FieldOfView = fov;
		setsizeneeded = true;
	}
}